

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O1

Abc_Ntk_t * Abc_NtkConstructFromCnf(Abc_Ntk_t *pNtk,Cnf_Man_t *p,Vec_Ptr_t *vMapped)

{
  uint uVar1;
  Vec_Ptr_t *pVVar2;
  void *pvVar3;
  Abc_Ntk_t *pNtk_00;
  Abc_Obj_t *pAVar4;
  long lVar5;
  Vec_Int_t *vCover;
  int *piVar6;
  void *pvVar7;
  char *pcVar8;
  Vec_Ptr_t *pVVar9;
  Vec_Int_t *vCover_00;
  int iVar10;
  ulong uVar11;
  Mem_Flex_t *pMan;
  Abc_Ntk_t *pAVar12;
  long lVar13;
  
  pNtk_00 = Abc_NtkStartFrom(pNtk,ABC_NTK_LOGIC,ABC_FUNC_SOP);
  pAVar4 = Abc_NtkCreateNodeConst1(pNtk_00);
  (p->pManAig->pConst1->field_5).pData = pAVar4;
  pVVar9 = pNtk->vCis;
  if (0 < pVVar9->nSize) {
    lVar5 = 0;
    do {
      pVVar2 = p->pManAig->vCis;
      if (pVVar2->nSize <= lVar5) goto LAB_002a9fed;
      *(undefined8 *)((long)pVVar2->pArray[lVar5] + 0x28) =
           *(undefined8 *)((long)pVVar9->pArray[lVar5] + 0x40);
      lVar5 = lVar5 + 1;
      pVVar9 = pNtk->vCis;
    } while (lVar5 < pVVar9->nSize);
  }
  vCover = (Vec_Int_t *)malloc(0x10);
  vCover->nCap = 0x10000;
  vCover->nSize = 0;
  piVar6 = (int *)malloc(0x40000);
  vCover->pArray = piVar6;
  if (0 < vMapped->nSize) {
    lVar5 = 0;
    do {
      pvVar3 = vMapped->pArray[lVar5];
      pAVar4 = Abc_NtkCreateObj(pNtk_00,ABC_OBJ_NODE);
      pcVar8 = *(char **)((long)pvVar3 + 0x28);
      uVar11 = (ulong)(uint)(int)*pcVar8;
      if (0 < *pcVar8) {
        lVar13 = 0;
        do {
          pVVar9 = p->pManAig->vObjs;
          if (pVVar9 == (Vec_Ptr_t *)0x0) {
            pvVar7 = (void *)0x0;
          }
          else {
            uVar1 = *(uint *)(pcVar8 + lVar13 * 4 + 0x18);
            if (((int)uVar1 < 0) || (pVVar9->nSize <= (int)uVar1)) goto LAB_002a9fed;
            pvVar7 = pVVar9->pArray[uVar1];
          }
          if (pvVar7 == (void *)0x0) break;
          Abc_ObjAddFanin(pAVar4,*(Abc_Obj_t **)((long)pvVar7 + 0x28));
          lVar13 = lVar13 + 1;
          uVar11 = (ulong)*pcVar8;
        } while (lVar13 < (long)uVar11);
      }
      iVar10 = (int)uVar11;
      if ((char)uVar11 < '\x05') {
        Cnf_SopConvertToVector
                  (p->pSops[*(ushort *)(pcVar8 + (long)(char)uVar11 * 4 + 0x18)],
                   (int)p->pSopSizes[*(ushort *)(pcVar8 + (long)(char)uVar11 * 4 + 0x18)],vCover);
        pMan = (Mem_Flex_t *)pNtk_00->pManFunc;
        iVar10 = (int)*pcVar8;
        vCover_00 = vCover;
      }
      else {
        pMan = (Mem_Flex_t *)pNtk_00->pManFunc;
        vCover_00 = *(Vec_Int_t **)(pcVar8 + 0x10);
      }
      pcVar8 = Abc_SopCreateFromIsop(pMan,iVar10,vCover_00);
      (pAVar4->field_5).pData = pcVar8;
      *(Abc_Obj_t **)((long)pvVar3 + 0x28) = pAVar4;
      lVar5 = lVar5 + 1;
    } while (lVar5 < vMapped->nSize);
  }
  if (vCover->pArray != (int *)0x0) {
    free(vCover->pArray);
    vCover->pArray = (int *)0x0;
  }
  free(vCover);
  pVVar9 = pNtk->vCos;
  if (0 < pVVar9->nSize) {
    lVar5 = 0;
    do {
      pVVar2 = p->pManAig->vCos;
      if (pVVar2->nSize <= lVar5) {
LAB_002a9fed:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      uVar11 = *(ulong *)((long)pVVar2->pArray[lVar5] + 8);
      Abc_ObjAddFanin(*(Abc_Obj_t **)((long)pVVar9->pArray[lVar5] + 0x40),
                      (Abc_Obj_t *)
                      ((ulong)((uint)uVar11 & 1) ^ *(ulong *)((uVar11 & 0xfffffffffffffffe) + 0x28))
                     );
      lVar5 = lVar5 + 1;
      pVVar9 = pNtk->vCos;
    } while (lVar5 < pVVar9->nSize);
  }
  pAVar4 = (Abc_Obj_t *)(p->pManAig->pConst1->field_5).pData;
  if ((pAVar4->vFanouts).nSize == 0) {
    Abc_NtkDeleteObj(pAVar4);
  }
  Abc_NtkLogicMakeSimpleCos(pNtk_00,1);
  pAVar12 = pNtk_00;
  iVar10 = Abc_NtkCheck(pNtk_00);
  if (iVar10 == 0) {
    Abc_Print((int)pAVar12,"Abc_NtkConstructFromCnf(): Network check has failed.\n");
  }
  return pNtk_00;
}

Assistant:

Abc_Ntk_t * Abc_NtkConstructFromCnf( Abc_Ntk_t * pNtk, Cnf_Man_t * p, Vec_Ptr_t * vMapped )
{
    Abc_Ntk_t * pNtkNew;
    Abc_Obj_t * pNode, * pNodeNew;
    Aig_Obj_t * pObj, * pLeaf;
    Cnf_Cut_t * pCut;
    Vec_Int_t * vCover;
    unsigned uTruth;
    int i, k, nDupGates;
    // create the new network
    pNtkNew = Abc_NtkStartFrom( pNtk, ABC_NTK_LOGIC, ABC_FUNC_SOP );
    // make the mapper point to the new network
    Aig_ManConst1(p->pManAig)->pData = Abc_NtkCreateNodeConst1(pNtkNew);
    Abc_NtkForEachCi( pNtk, pNode, i )
        Aig_ManCi(p->pManAig, i)->pData = pNode->pCopy;
    // process the nodes in topological order
    vCover = Vec_IntAlloc( 1 << 16 );
    Vec_PtrForEachEntry( Aig_Obj_t *, vMapped, pObj, i )
    {
        // create new node
        pNodeNew = Abc_NtkCreateNode( pNtkNew );
        // add fanins according to the cut
        pCut = (Cnf_Cut_t *)pObj->pData;
        Cnf_CutForEachLeaf( p->pManAig, pCut, pLeaf, k )
            Abc_ObjAddFanin( pNodeNew, (Abc_Obj_t *)pLeaf->pData );
        // add logic function
        if ( pCut->nFanins < 5 )
        {
            uTruth = 0xFFFF & *Cnf_CutTruth(pCut);
            Cnf_SopConvertToVector( p->pSops[uTruth], p->pSopSizes[uTruth], vCover );
            pNodeNew->pData = Abc_SopCreateFromIsop( (Mem_Flex_t *)pNtkNew->pManFunc, pCut->nFanins, vCover );
        }
        else
            pNodeNew->pData = Abc_SopCreateFromIsop( (Mem_Flex_t *)pNtkNew->pManFunc, pCut->nFanins, pCut->vIsop[1] );
        // save the node
        pObj->pData = pNodeNew;
    }
    Vec_IntFree( vCover );
    // add the CO drivers
    Abc_NtkForEachCo( pNtk, pNode, i )
    {
        pObj = Aig_ManCo(p->pManAig, i);
        pNodeNew = Abc_ObjNotCond( (Abc_Obj_t *)Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0(pObj) );
        Abc_ObjAddFanin( pNode->pCopy, pNodeNew );
    }

    // remove the constant node if not used
    pNodeNew = (Abc_Obj_t *)Aig_ManConst1(p->pManAig)->pData;
    if ( Abc_ObjFanoutNum(pNodeNew) == 0 )
        Abc_NtkDeleteObj( pNodeNew );
    // minimize the node
//    Abc_NtkSweep( pNtkNew, 0 );
    // decouple the PO driver nodes to reduce the number of levels
    nDupGates = Abc_NtkLogicMakeSimpleCos( pNtkNew, 1 );
//    if ( nDupGates && If_ManReadVerbose(pIfMan) )
//        Abc_Print( 1, "Duplicated %d gates to decouple the CO drivers.\n", nDupGates );
    if ( !Abc_NtkCheck( pNtkNew ) )
        Abc_Print( 1, "Abc_NtkConstructFromCnf(): Network check has failed.\n" );
    return pNtkNew;
}